

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operation.cc
# Opt level: O1

ostream * operator<<(ostream *out,Operation *op)

{
  int iVar1;
  ostream *poVar2;
  char local_1b;
  char local_1a [2];
  
  (*op->_vptr_Operation[2])(op);
  poVar2 = std::ostream::_M_insert<long>((long)out);
  local_1b = ' ';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b,1);
  iVar1 = (*op->_vptr_Operation[4])(op);
  local_1a[0] = (char)iVar1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1a,1);
  local_1a[1] = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1a + 1,1);
  (*op->_vptr_Operation[3])(op);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
  (*op->_vptr_Operation[5])(op);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  return poVar2;
}

Assistant:

ostream &operator<<(ostream &out, const Operation &op)
{
	return out << op.left() << ' ' << op.opchar() << ' ' << op.right()
		   << " = " << op.result();
}